

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

vector<CardStyle,_std::allocator<CardStyle>_> * __thiscall
BattleWithLandlord::GenStrategy
          (vector<CardStyle,_std::allocator<CardStyle>_> *__return_storage_ptr__,
          BattleWithLandlord *this,multiset<char,_std::less<char>,_std::allocator<char>_> *style,
          CardStyle *last)

{
  int iVar1;
  _Rb_tree_header *p_Var2;
  Type TVar3;
  pointer pCVar4;
  pointer pCVar5;
  _Rb_tree_color _Var6;
  undefined8 uVar7;
  bool bVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  iterator iVar12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_iterator<std::pair<const_char,_int>_> _Var14;
  _Rb_tree_iterator<std::pair<const_char,_int>_> _Var15;
  long lVar16;
  CardStyle *pCVar17;
  _Rb_tree_node_base *p_Var18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  multiset<char,_std::less<char>,_std::allocator<char>_> *cs;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range10;
  pointer pmVar23;
  long lVar24;
  int iVar25;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range7;
  _Base_ptr p_Var26;
  __normal_iterator<CardStyle_*,_std::vector<CardStyle,_std::allocator<CardStyle>_>_> __i;
  pointer pCVar27;
  char x;
  undefined3 uStack_1cb;
  _Rb_tree_node_base *local_1c8;
  int carry;
  _Rb_tree_node_base *local_1b8;
  CardStyle *local_1b0;
  int local_1a4;
  pointer local_1a0;
  char x_2;
  undefined3 uStack_193;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms_1;
  _Rb_tree_node_base *local_120;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  comb_res;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count;
  multiset<char,_std::less<char>,_std::allocator<char>_> _union;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count_;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_60;
  
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  count._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &count._M_t._M_impl.super__Rb_tree_header._M_header;
  count._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  count._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  count._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  count._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       count._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var11 = (style->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &(style->_M_t)._M_impl.super__Rb_tree_header;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    p_Var18 = p_Var11 + 1;
    iVar9 = std::
            _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
            ::find(&count._M_t,(key_type *)p_Var18);
    if ((_Rb_tree_header *)iVar9._M_node == &count._M_t._M_impl.super__Rb_tree_header) {
      pmVar10 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                            *)&count._M_t,(key_type *)p_Var18);
      *pmVar10 = 1;
    }
    else {
      pmVar10 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                            *)&count._M_t,(key_type *)p_Var18);
      *pmVar10 = *pmVar10 + 1;
    }
  }
  ms._M_t._M_impl._0_1_ = 0x11;
  iVar9 = std::
          _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
          ::find(&count._M_t,(key_type *)&ms);
  ms._M_t._M_impl._0_1_ = 0x12;
  iVar12 = std::
           _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
           ::find(&count._M_t,(key_type *)&ms);
  p_Var2 = &count._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)iVar9._M_node != p_Var2) && ((_Rb_tree_header *)iVar12._M_node != p_Var2))
  {
    ms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &ms._M_t._M_impl.super__Rb_tree_header._M_header;
    ms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ms_1._M_t._M_impl._0_1_ = 0x11;
    ms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         ms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    _M_insert_equal<char>(&ms._M_t,(char *)&ms_1);
    ms_1._M_t._M_impl._0_1_ = 0x12;
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    _M_insert_equal<char>(&ms._M_t,(char *)&ms_1);
    ms_1._M_t._M_impl._0_4_ = 6;
    count_._M_t._M_impl._0_4_ = 0x13;
    std::vector<CardStyle,std::allocator<CardStyle>>::
    emplace_back<CardStyle::Type,int,std::multiset<char,std::less<char>,std::allocator<char>>&>
              ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,(Type *)&ms_1,
               (int *)&count_,&ms);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree(&ms._M_t);
  }
  if (last->type == PASS) {
    p_Var11 = count._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var11 != &count._M_t._M_impl.super__Rb_tree_header) {
      local_1c8 = p_Var11 + 1;
      local_1b8 = p_Var11;
      for (uVar22 = 1; (uVar22 < 5 && ((int)uVar22 <= *(int *)&local_1b8[1].field_0x4));
          uVar22 = uVar22 + 1) {
        ms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        ms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        ms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &ms._M_t._M_impl.super__Rb_tree_header._M_header;
        ms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        ms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             ms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        uVar21 = uVar22;
        while (p_Var18 = local_1c8, bVar8 = uVar21 != 0, uVar21 = uVar21 - 1, bVar8) {
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)&ms,(char *)local_1c8);
        }
        if (uVar22 == 1) {
          if ((char)local_1c8->_M_color < '\x01') {
            ms_1._M_t._M_impl._0_4_ = 7;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                       (Type *)&ms_1,(char *)local_1c8,&ms);
          }
          else {
            ms_1._M_t._M_impl._0_4_ = 1;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                       (Type *)&ms_1,(char *)local_1c8,&ms);
          }
          ms_1._M_t._M_impl._0_4_ = 1;
          _Var15._M_node = local_1b8;
          iVar20 = (int)(char)local_1c8->_M_color;
          while (_Var14 = std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>(_Var15,1),
                (_Rb_tree_header *)_Var14._M_node != &count._M_t._M_impl.super__Rb_tree_header) {
            _Var15._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var15._M_node);
            iVar25 = (int)(char)_Var15._M_node[1]._M_color;
            if (iVar20 + 1 != iVar25) break;
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)(_Var15._M_node + 1));
            iVar1 = ms_1._M_t._M_impl._0_4_ + 1;
            bVar8 = 3 < (int)ms_1._M_t._M_impl._0_4_;
            iVar20 = iVar25;
            ms_1._M_t._M_impl._0_4_ = iVar1;
            if (bVar8) {
              count_._M_t._M_impl._0_4_ = 1;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                         (Type *)&count_,(char *)local_1c8,&ms,(int *)&ms_1);
            }
          }
        }
        else if (uVar22 == 2) {
          ms_1._M_t._M_impl._0_4_ = 2;
          std::vector<CardStyle,std::allocator<CardStyle>>::
          emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                    ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                     (Type *)&ms_1,(char *)local_1c8,&ms);
          ms_1._M_t._M_impl._0_4_ = 1;
          _Var15._M_node = local_1b8;
          iVar20 = (int)(char)p_Var18->_M_color;
          while (_Var14 = std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>(_Var15,1),
                (_Rb_tree_header *)_Var14._M_node != &count._M_t._M_impl.super__Rb_tree_header) {
            _Var15._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var15._M_node);
            iVar25 = (int)(char)_Var15._M_node[1]._M_color;
            if ((iVar20 + 1 != iVar25) || (*(int *)&_Var15._M_node[1].field_0x4 < 2)) break;
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)(_Var15._M_node + 1));
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)(_Var15._M_node + 1));
            iVar1 = ms_1._M_t._M_impl._0_4_ + 1;
            bVar8 = 1 < (int)ms_1._M_t._M_impl._0_4_;
            iVar20 = iVar25;
            ms_1._M_t._M_impl._0_4_ = iVar1;
            if (bVar8) {
              count_._M_t._M_impl._0_4_ = 2;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                         (Type *)&count_,(char *)local_1c8,&ms,(int *)&ms_1);
            }
          }
        }
        else if (uVar22 == 3) {
          ms_1._M_t._M_impl._0_4_ = 3;
          std::vector<CardStyle,std::allocator<CardStyle>>::
          emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                    ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                     (Type *)&ms_1,(char *)local_1c8,&ms);
          _x = MONO;
          _Var15._M_node = local_1b8;
          iVar20 = (int)(char)p_Var18->_M_color;
          while (_Var14 = std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>(_Var15,1),
                (_Rb_tree_header *)_Var14._M_node != &count._M_t._M_impl.super__Rb_tree_header) {
            _Var15._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var15._M_node);
            iVar25 = (int)(char)_Var15._M_node[1]._M_color;
            if ((iVar20 + 1 != iVar25) || (*(int *)&_Var15._M_node[1].field_0x4 < 3)) break;
            p_Var26 = _Var15._M_node + 1;
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)p_Var26);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)p_Var26);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)p_Var26);
            _x = _x + MONO;
            ms_1._M_t._M_impl._0_4_ = 3;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                      ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                       (Type *)&ms_1,(char *)local_1c8,&ms,(int *)&x);
            iVar20 = iVar25;
          }
          comb_res.
          super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000001;
          pCVar17 = (CardStyle *)0x0;
          while (pCVar17 != (CardStyle *)0x8) {
            carry = *(int *)((long)&pCVar17->type +
                            (long)&comb_res.
                                   super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                            );
            local_1b0 = pCVar17;
            std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::clear((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)&ms);
            p_Var18 = local_1c8;
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)local_1c8);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)p_Var18);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms,(char *)p_Var18);
            _x = MONO;
            local_1a0 = (pointer)CONCAT44(local_1a0._4_4_,(int)(char)p_Var18->_M_color);
            std::
            _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
            ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        *)&ms_1,&count._M_t);
            p_Var18 = local_1b8;
            do {
              if ((_Rb_tree_header *)p_Var18 == &count._M_t._M_impl.super__Rb_tree_header) break;
              pmVar10 = std::
                        map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                        ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                      *)&ms_1,(key_type *)(p_Var18 + 1));
              *pmVar10 = 0;
              _union._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              _union._M_t._M_impl._0_8_ = 0;
              _union._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              _union._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              bVar8 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)&ms_1,_x,carry,
                               (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                *)&_union);
              uVar7 = _union._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
              lVar16 = _union._M_t._M_impl._0_8_;
              if (bVar8) {
                for (; lVar16 != uVar7; lVar16 = lVar16 + 0x30) {
                  std::
                  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                  ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                              *)&count_,&ms._M_t);
                  for (p_Var13 = *(_Rb_tree_node_base **)(lVar16 + 0x18);
                      p_Var13 != (_Rb_tree_node_base *)(lVar16 + 8);
                      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                    _x_2 = CONCAT31(uStack_193,(char)p_Var13[1]._M_color);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)&count_,&x_2);
                  }
                  _x_2 = TRIPLE;
                  std::vector<CardStyle,std::allocator<CardStyle>>::
                  emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int&>
                            ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                             (Type *)&x_2,(char *)local_1c8,
                             (multiset<char,_std::less<char>,_std::allocator<char>_> *)&count_,
                             (int *)&x,&carry);
                  std::
                  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                  ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                               *)&count_);
                }
              }
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
              if ((_Rb_tree_header *)p_Var18 == &count._M_t._M_impl.super__Rb_tree_header) {
LAB_0010b9bb:
                bVar8 = false;
              }
              else {
                iVar20 = (int)(char)p_Var18[1]._M_color;
                if ((int)local_1a0 + 1 != iVar20) {
                  local_1a0 = (pointer)CONCAT44(local_1a0._4_4_,(int)local_1a0 + 1);
                  goto LAB_0010b9bb;
                }
                bVar8 = 2 < *(int *)&p_Var18[1].field_0x4;
                if (bVar8) {
                  p_Var13 = p_Var18 + 1;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&ms,(char *)p_Var13);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&ms,(char *)p_Var13);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&ms,(char *)p_Var13);
                  _x = _x + MONO;
                }
                local_1a0 = (pointer)CONCAT44(local_1a0._4_4_,iVar20);
              }
              std::
              vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                         *)&_union);
            } while (bVar8);
            std::
            _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
            ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                         *)&ms_1);
            pCVar17 = (CardStyle *)&local_1b0->id;
          }
        }
        else {
          ms_1._M_t._M_impl._0_4_ = 5;
          std::vector<CardStyle,std::allocator<CardStyle>>::
          emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                    ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                     (Type *)&ms_1,(char *)local_1c8,&ms);
          std::
          _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
          ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      *)&ms_1,&count._M_t);
          pmVar10 = std::
                    map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                    operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                *)&ms_1,(key_type *)local_1c8);
          *pmVar10 = *pmVar10 + -4;
          comb_res.
          super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000001;
          for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 4) {
            _x = *(Type *)((long)&comb_res.
                                  super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar16);
            _union._M_t._M_impl._0_8_ = 0;
            _union._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            _union._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            _union._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            bVar8 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                              *)&ms_1,2,_x,
                             (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                              *)&_union);
            uVar7 = _union._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
            lVar24 = _union._M_t._M_impl._0_8_;
            if (bVar8) {
              for (; lVar24 != uVar7; lVar24 = lVar24 + 0x30) {
                std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                _Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                          *)&count_,&ms._M_t);
                for (p_Var18 = *(_Rb_tree_node_base **)(lVar24 + 0x18);
                    p_Var18 != (_Rb_tree_node_base *)(lVar24 + 8);
                    p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
                  carry = CONCAT31(carry._1_3_,(char)p_Var18[1]._M_color);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&count_,(char *)&carry);
                }
                carry = 4;
                _x_2 = PAIR;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int&>
                          ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                           (Type *)&carry,(char *)local_1c8,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)&count_,
                           (int *)&x_2,(int *)&x);
                std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                           *)&count_);
              }
            }
            std::
            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                       *)&_union);
          }
          std::
          _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
          ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                       *)&ms_1);
        }
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree(&ms._M_t);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_1b8);
    }
    pCVar4 = (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pCVar5 = (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar4 != pCVar5) {
      uVar19 = (long)pCVar5 - (long)pCVar4 >> 6;
      lVar16 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<CardStyle*,std::vector<CardStyle,std::allocator<CardStyle>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<BattleWithLandlord::GenStrategy(std::multiset<char,std::less<char>,std::allocator<char>>const&,CardStyle_const&)const::__0>>
                (pCVar4,pCVar5,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pCVar5 - (long)pCVar4 < 0x401) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<CardStyle*,std::vector<CardStyle,std::allocator<CardStyle>>>,__gnu_cxx::__ops::_Iter_comp_iter<BattleWithLandlord::GenStrategy(std::multiset<char,std::less<char>,std::allocator<char>>const&,CardStyle_const&)const::__0>>
                  (pCVar4,pCVar5);
      }
      else {
        pCVar27 = pCVar4 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<CardStyle*,std::vector<CardStyle,std::allocator<CardStyle>>>,__gnu_cxx::__ops::_Iter_comp_iter<BattleWithLandlord::GenStrategy(std::multiset<char,std::less<char>,std::allocator<char>>const&,CardStyle_const&)const::__0>>
                  (pCVar4,pCVar27);
        for (; pCVar27 != pCVar5; pCVar27 = pCVar27 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<CardStyle*,std::vector<CardStyle,std::allocator<CardStyle>>>,__gnu_cxx::__ops::_Val_comp_iter<BattleWithLandlord::GenStrategy(std::multiset<char,std::less<char>,std::allocator<char>>const&,CardStyle_const&)const::__0>>
                    (pCVar27);
        }
      }
    }
  }
  else {
    local_1c8 = (_Rb_tree_node_base *)&last->carry;
    p_Var11 = count._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1b0 = last;
    while ((_Rb_tree_header *)p_Var11 != &count._M_t._M_impl.super__Rb_tree_header) {
      ms_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      ms_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ms_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &ms_1._M_t._M_impl.super__Rb_tree_header._M_header;
      ms_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var18 = p_Var11 + 1;
      local_1b8 = p_Var11;
      ms_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           ms_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (*(int *)&p_Var11[1].field_0x4 == 4) {
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &ms_1,(char *)p_Var18);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &ms_1,(char *)p_Var18);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &ms_1,(char *)p_Var18);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &ms_1,(char *)p_Var18);
        _Var6 = p_Var18->_M_color;
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        _Rb_tree(&local_60,
                 (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                  *)&ms_1);
        CardStyle::CardStyle
                  ((CardStyle *)&ms,QUARD_BOMB,(int)(char)_Var6,
                   (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_60,1,0);
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree(&local_60);
        bVar8 = operator<(last,(CardStyle *)&ms);
        if (bVar8) {
          std::vector<CardStyle,std::allocator<CardStyle>>::emplace_back<CardStyle&>
                    ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                     (CardStyle *)&ms);
        }
        if (last->type != QUARD) {
LAB_0010ae28:
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          clear(&ms_1._M_t);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)&ms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          goto LAB_0010ae42;
        }
        if (last->id < (int)(char)p_Var18->_M_color) {
          std::
          _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
          ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      *)&count_,&count._M_t);
          pmVar10 = std::
                    map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                    operator[](&count_,(key_type *)p_Var18);
          *pmVar10 = *pmVar10 + -4;
          comb_res.
          super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          comb_res.
          super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          comb_res.
          super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar8 = GenCarry(&count_,2,local_1c8->_M_color,&comb_res);
          if (bVar8) {
            local_1a0 = comb_res.
                        super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            for (pmVar23 = comb_res.
                           super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pmVar23 != local_1a0;
                pmVar23 = pmVar23 + 1) {
              std::
              _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
              _Rb_tree(&_union._M_t,&ms_1._M_t);
              for (p_Var13 = (pmVar23->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var13 != &(pmVar23->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                _x = CONCAT31(uStack_1cb,(char)p_Var13[1]._M_color);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&_union,&x);
              }
              _x = QUARD;
              carry = 2;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int_const&>
                        ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                         (Type *)&x,(char *)p_Var18,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)&_union._M_t,
                         &carry,(int *)local_1c8);
              std::
              _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
              ~_Rb_tree(&_union._M_t);
              last = local_1b0;
            }
          }
          std::
          vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
          ::~vector(&comb_res);
          std::
          _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
          ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                       *)&count_);
          goto LAB_0010ae28;
        }
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                   *)&ms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      }
      else {
LAB_0010ae42:
        TVar3 = last->type;
        if (TVar3 == TRIPLE) {
          if ((last->id < (int)(char)p_Var18->_M_color) && (2 < *(int *)&local_1b8[1].field_0x4)) {
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms_1,(char *)p_Var18);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms_1,(char *)p_Var18);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms_1,(char *)p_Var18);
            if (local_1c8->_M_color == _S_red) {
              if (last->len == 1) {
                ms._M_t._M_impl._0_4_ = 3;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                          ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                           (Type *)&ms,(char *)p_Var18,&ms_1);
              }
              else {
                ms._M_t._M_impl._0_4_ = 1;
                _Var15._M_node = local_1b8;
                iVar20 = (int)(char)p_Var18->_M_color;
                do {
                  _Var14 = std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>(_Var15,1);
                  last = local_1b0;
                  if ((_Rb_tree_header *)_Var14._M_node == &count._M_t._M_impl.super__Rb_tree_header
                     ) goto LAB_0010b3b6;
                  _Var15._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var15._M_node);
                  iVar25 = (int)(char)_Var15._M_node[1]._M_color;
                  last = local_1b0;
                  if ((iVar20 + 1 != iVar25) || (*(int *)&_Var15._M_node[1].field_0x4 < 3))
                  goto LAB_0010b3b6;
                  p_Var26 = _Var15._M_node + 1;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&ms_1,(char *)p_Var26);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&ms_1,(char *)p_Var26);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&ms_1,(char *)p_Var26);
                  ms._M_t._M_impl._0_4_ = ms._M_t._M_impl._0_4_ + 1;
                  iVar20 = iVar25;
                } while (ms._M_t._M_impl._0_4_ != local_1b0->len);
                count_._M_t._M_impl._0_4_ = 3;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                          ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                           (Type *)&count_,(char *)p_Var18,&ms_1,(int *)&ms);
                last = local_1b0;
              }
            }
            else {
              std::
              _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
              clear((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)&ms_1);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&ms_1,(char *)p_Var18);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&ms_1,(char *)p_Var18);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&ms_1,(char *)p_Var18);
              comb_res.
              super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(comb_res.
                                     super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
              local_1a4 = (int)(char)p_Var18->_M_color;
              std::
              _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
              ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                          *)&ms,&count._M_t);
              local_120 = local_1b8;
              do {
                if ((_Rb_tree_header *)local_120 == &count._M_t._M_impl.super__Rb_tree_header)
                break;
                pmVar10 = std::
                          map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                          ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                        *)&ms,(key_type *)(local_120 + 1));
                *pmVar10 = 0;
                _union._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                _union._M_t._M_impl._0_8_ = 0;
                _union._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                _union._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                if (((uint)comb_res.
                           super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == last->len) &&
                   (bVar8 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                      *)&ms,(uint)comb_res.
                                                  super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                     local_1c8->_M_color,
                                     (vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                      *)&_union), bVar8)) {
                  local_1a0 = (pointer)_union._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                  for (pmVar23 = (pointer)_union._M_t._M_impl._0_8_; pmVar23 != local_1a0;
                      pmVar23 = pmVar23 + 1) {
                    std::
                    _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                    ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                *)&count_,
                               (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                *)&ms_1);
                    for (p_Var13 = (pmVar23->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                        (_Rb_tree_header *)p_Var13 != &(pmVar23->_M_t)._M_impl.super__Rb_tree_header
                        ; p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                      _x = CONCAT31(uStack_1cb,(char)p_Var13[1]._M_color);
                      std::
                      _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      ::_M_insert_equal<char_const&>
                                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                  *)&count_,&x);
                    }
                    _x = TRIPLE;
                    std::vector<CardStyle,std::allocator<CardStyle>>::
                    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int_const&>
                              ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__
                               ,(Type *)&x,(char *)p_Var18,
                               (multiset<char,_std::less<char>,_std::allocator<char>_> *)&count_,
                               (int *)&comb_res,(int *)local_1c8);
                    std::
                    _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                    ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                 *)&count_);
                  }
LAB_0010b107:
                  bVar8 = false;
                  iVar20 = local_1a4;
                }
                else {
                  local_120 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_120);
                  if ((_Rb_tree_header *)local_120 == &count._M_t._M_impl.super__Rb_tree_header)
                  goto LAB_0010b107;
                  iVar20 = (int)(char)local_120[1]._M_color;
                  local_1a4 = local_1a4 + 1;
                  if (local_1a4 != iVar20) goto LAB_0010b107;
                  bVar8 = 2 < *(int *)&local_120[1].field_0x4;
                  if (bVar8) {
                    p_Var13 = local_120 + 1;
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)&ms_1,(char *)p_Var13);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)&ms_1,(char *)p_Var13);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)&ms_1,(char *)p_Var13);
                    comb_res.
                    super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(comb_res.
                                           super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (uint)comb_res.
                                                 super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                  }
                }
                local_1a4 = iVar20;
                std::
                vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                           *)&_union);
                last = local_1b0;
              } while (bVar8);
              std::
              _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
              ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                           *)&ms);
            }
          }
        }
        else if (TVar3 == PAIR) {
          if ((last->id < (int)(char)p_Var18->_M_color) && (1 < *(int *)&local_1b8[1].field_0x4)) {
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms_1,(char *)p_Var18);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&ms_1,(char *)p_Var18);
            if (last->len == 1) {
              ms._M_t._M_impl._0_4_ = 2;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                         (Type *)&ms,(char *)p_Var18,&ms_1);
            }
            else {
              ms._M_t._M_impl._0_4_ = 1;
              _Var15._M_node = local_1b8;
              iVar20 = (int)(char)p_Var18->_M_color;
              do {
                _Var14 = std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>(_Var15,1);
                last = local_1b0;
                if ((_Rb_tree_header *)_Var14._M_node == &count._M_t._M_impl.super__Rb_tree_header)
                goto LAB_0010b3b6;
                _Var15._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var15._M_node);
                iVar25 = (int)(char)_Var15._M_node[1]._M_color;
                last = local_1b0;
                if ((iVar20 + 1 != iVar25) || (*(int *)&_Var15._M_node[1].field_0x4 < 2))
                goto LAB_0010b3b6;
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&ms_1,(char *)(_Var15._M_node + 1));
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&ms_1,(char *)(_Var15._M_node + 1));
                iVar1 = ms._M_t._M_impl._0_4_ + 1;
                bVar8 = (int)ms._M_t._M_impl._0_4_ < 2;
                iVar20 = iVar25;
                ms._M_t._M_impl._0_4_ = iVar1;
              } while ((bVar8) || (iVar1 != local_1b0->len));
              count_._M_t._M_impl._0_4_ = 2;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                         (Type *)&count_,(char *)p_Var18,&ms_1,(int *)&ms);
              last = local_1b0;
            }
          }
        }
        else if ((TVar3 == MONO) && (last->id < (int)(char)p_Var18->_M_color)) {
          std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
          _M_insert_equal<char_const&>
                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      *)&ms_1,(char *)p_Var18);
          if (last->len == 1) {
            ms._M_t._M_impl._0_4_ = 1;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                       (Type *)&ms,(char *)p_Var18,&ms_1);
          }
          else {
            ms._M_t._M_impl._0_4_ = 1;
            _Var15._M_node = local_1b8;
            iVar20 = (int)(char)p_Var18->_M_color;
            do {
              _Var14 = std::next<std::_Rb_tree_iterator<std::pair<char_const,int>>>(_Var15,1);
              last = local_1b0;
              if ((_Rb_tree_header *)_Var14._M_node == &count._M_t._M_impl.super__Rb_tree_header)
              goto LAB_0010b3b6;
              _Var15._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var15._M_node);
              iVar25 = (int)(char)_Var15._M_node[1]._M_color;
              last = local_1b0;
              if (iVar20 + 1 != iVar25) goto LAB_0010b3b6;
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&ms_1,(char *)(_Var15._M_node + 1));
              iVar1 = ms._M_t._M_impl._0_4_ + 1;
              bVar8 = (int)ms._M_t._M_impl._0_4_ < 4;
              iVar20 = iVar25;
              ms._M_t._M_impl._0_4_ = iVar1;
            } while ((bVar8) || (iVar1 != local_1b0->len));
            count_._M_t._M_impl._0_4_ = 1;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                      ((vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__,
                       (Type *)&count_,(char *)p_Var18,&ms_1,(int *)&ms);
            last = local_1b0;
          }
        }
      }
LAB_0010b3b6:
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&ms_1._M_t);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_1b8);
    }
    std::vector<CardStyle,_std::allocator<CardStyle>_>::emplace_back<>(__return_storage_ptr__);
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&count._M_t);
  return __return_storage_ptr__;
}

Assistant:

vector<CardStyle> BattleWithLandlord::GenStrategy(const multiset<byte> &style, const CardStyle &last) const {
    vector <CardStyle> all;
    map<byte, int> count;
    for (auto c = style.begin(); c != style.end(); ++c) {
        if (count.find(*c) != count.end()) {
            ++count[*c];
        } else {
            count[*c] = 1;
        }
    }
    auto vice_joker = count.find(17);
    auto joker = count.find(18);
    if (vice_joker != count.end() && joker != count.end()){
        multiset<byte> ms;
        ms.insert(17);
        ms.insert(18);
        all.emplace_back(CardStyle::JOKER_BOMB, 19, ms);
    }
    if (last.type == CardStyle::PASS) {
        for (auto c = count.begin(); c != count.end(); ++c) {
            for (int k = 1; k <= c->second && k <= 4; ++k) {
                multiset<byte> ms;
                for (int i = 0; i < k; ++i) {
                    ms.insert(c->first);
                }
                if (k == 1) {
                    if (c->first > 0)
                        all.emplace_back(CardStyle::MONO, c->first, ms);
                    else
                        all.emplace_back(CardStyle::EXT, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            all.emplace_back(CardStyle::MONO, c->first, ms, len);
                        }
                    }
                } else if (k == 2) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                        }
                    }
                } else if (k == 3) {
                    all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    int len = 1;
                    int prev = c->first;

                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                    }
                    
                    for (int carry : {1, 2}) {
                        ms.clear();
                        ms.insert(c->first);
                        ms.insert(c->first);
                        ms.insert(c->first);
                        len = 1;
                        prev = c->first;
                        auto count_ = count;
                        for (auto it = c; it != count.end();) {
                            count_[it->first] = 0; // in case of 333 + 3

                            vector<multiset<byte> > comb_res;
                            if (GenCarry(count_, len, carry, comb_res)) {
                                for (auto &cs: comb_res) {
                                    multiset<byte> _union = ms;
                                    for (auto x: cs) {
                                        _union.insert(x);
                                    }
                                    all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, carry);
                                }
                            }
                            if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                        }
                    }
                } else {
                    all.emplace_back(CardStyle::QUARD_BOMB, c->first, ms);
                    auto count_ = count;
                    count_[c->first] -= 4;
                    for (auto carry: {1, 2}) {
                        vector<multiset<byte> > comb_res;
                        if (GenCarry(count_, 2, carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::QUARD, c->first, _union, 2, carry);
                            }
                        }
                    }
                }
            }
        }
        sort(all.begin(), all.end(),
             [](const CardStyle &a, const CardStyle &b) {
             return a.pattern.size() > b.pattern.size();
        });
    } else {
        for (auto c = count.begin(); c != count.end(); ++c) {
            multiset<byte> ms;
            if (c->second == 4) {
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                auto style = CardStyle(CardStyle::QUARD_BOMB, c->first, ms);
                if (last < style) {
                    all.emplace_back(style);
                }
                if (last.type == CardStyle::QUARD) {
                    if (c->first <= last.id) continue;
                    auto count_ = count;
                    count_[c->first] -= 4;
                    vector<multiset<byte> > comb_res;
                    if (GenCarry(count_, 2, last.carry, comb_res)) {
                        for (auto &cs: comb_res) {
                            multiset<byte> _union = ms;
                            for (auto x: cs) {
                                _union.insert(x);
                            }
                            all.emplace_back(CardStyle::QUARD, c->first, _union, 2, last.carry);
                        }
                    }
                }
                ms.clear();
            }
            if (last.type == CardStyle::MONO) {
                if (c->first <= last.id) continue;
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::MONO, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::MONO, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::PAIR) {
                if (c->first <= last.id || c->second < 2) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::TRIPLE) {
                if (c->first <= last.id || c->second < 3) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.carry == 0) {
                    if (last.len == 1) {
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    } else {
                        int len = 1;
                        int prev = c->first;
                        for (auto it = c; next(it) != count.end();) {
                            if ((++it)->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                            if (len == last.len) {
                                all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                                break;
                            }
                        }
                    }
                } else {
                    ms.clear();
                    ms.insert(c->first);
                    ms.insert(c->first);
                    ms.insert(c->first);
                    int len = 1;
                    int prev = c->first;
                    auto count_ = count;
                    for (auto it = c; it != count.end();) {
                        count_[it->first] = 0;

                        vector<multiset<byte> > comb_res;
                        if (len == last.len && GenCarry(count_, len, last.carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, last.carry);
                            }
                            break;
                        }

                        if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                    }
                }
            }
        }
        all.emplace_back(); // PASS
    }
    return all;
}